

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O0

bool __thiscall
HPack::Encoder::encodeResponse(Encoder *this,BitOStream *outputStream,HttpHeader *header)

{
  bool bVar1;
  size_type sVar2;
  reference field_00;
  Encoder *in_RDX;
  Encoder *in_RSI;
  char **in_RDI;
  long in_FS_OFFSET;
  HeaderField *field;
  HttpHeader *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  QMessageLogger *in_stack_ffffffffffffff90;
  HttpHeader *in_stack_ffffffffffffff98;
  Encoder *this_00;
  bool local_41;
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::size
                    ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)in_RDX);
  if (sVar2 == 0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff90,(char *)in_RDI,in_stack_ffffffffffffff84,
               (char *)in_stack_ffffffffffffff78);
    QMessageLogger::debug(local_28,"empty header");
    local_41 = false;
  }
  else {
    bVar1 = encodeResponsePseudoHeaders(in_RSI,(BitOStream *)in_RDX,in_stack_ffffffffffffff98);
    if (bVar1) {
      local_30._M_current = (HeaderField *)0xaaaaaaaaaaaaaaaa;
      this_00 = in_RDX;
      local_30._M_current =
           (HeaderField *)
           std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::begin
                     ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::end
                ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78), bVar1) {
        field_00 = __gnu_cxx::
                   __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                   ::operator*(&local_30);
        bVar1 = ::operator==(&field_00->name,in_RDI);
        if ((!bVar1) && (bVar1 = encodeHeaderField(this_00,(BitOStream *)in_RDX,field_00), !bVar1))
        {
          local_41 = false;
          goto LAB_00290f81;
        }
        __gnu_cxx::
        __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
        ::operator++(&local_30);
      }
      local_41 = true;
    }
    else {
      local_41 = false;
    }
  }
LAB_00290f81:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool Encoder::encodeResponse(BitOStream &outputStream, const HttpHeader &header)
{
    if (!header.size()) {
        qDebug("empty header");
        return false;
    }

    if (!encodeResponsePseudoHeaders(outputStream, header))
        return false;

    for (const auto &field : header) {
        if (field.name == ":status")
            continue;

        if (!encodeHeaderField(outputStream, field))
            return false;
    }

    return true;
}